

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall minja::LiteralExpr::~LiteralExpr(LiteralExpr *this)

{
  LiteralExpr *in_RDI;
  
  ~LiteralExpr(in_RDI);
  operator_delete(in_RDI,0x70);
  return;
}

Assistant:

LiteralExpr(const Location & loc, const Value& v)
      : Expression(loc), value(v) {}